

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O3

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol,double *array)

{
  uint uVar1;
  double **ppdVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  allocate(this,nrow,ncol);
  uVar1 = this->nrow_;
  if ((ulong)uVar1 != 0) {
    uVar4 = (ulong)this->ncol_;
    ppdVar2 = this->data_;
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar4 != 0) {
        pdVar3 = ppdVar2[uVar6];
        uVar7 = 0;
        do {
          pdVar3[uVar7] = array[(uint)((int)lVar5 + (int)uVar7)];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + uVar4;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol, Real* array) {
      allocate(nrow, ncol);
      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = array[i * ncol_ + j];
    }